

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_cfilter_add(Curl_easy *data,connectdata *conn,int sockindex)

{
  CURLcode CVar1;
  Curl_cfilter *in_RAX;
  undefined4 in_register_00000014;
  Curl_cfilter *cf;
  Curl_cfilter *local_28;
  
  local_28 = in_RAX;
  CVar1 = cf_ssl_create(&local_28,(Curl_easy *)conn,
                        (connectdata *)CONCAT44(in_register_00000014,sockindex));
  if (CVar1 == CURLE_OK) {
    Curl_conn_cf_add(data,conn,sockindex,local_28);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_ssl_cfilter_add(struct Curl_easy *data,
                              struct connectdata *conn,
                              int sockindex)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  result = cf_ssl_create(&cf, data, conn);
  if(!result)
    Curl_conn_cf_add(data, conn, sockindex, cf);
  return result;
}